

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeCommitPhaseTwo(Btree *p,int bCleanup)

{
  int *piVar1;
  int iVar2;
  BtShared *pBVar3;
  Pager *pPager;
  u8 uVar4;
  uint uVar5;
  code *pcVar6;
  
  uVar4 = p->inTrans;
  if (uVar4 == '\0') {
    return 0;
  }
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
    uVar4 = p->inTrans;
  }
  if (uVar4 == '\x02') {
    pBVar3 = p->pBt;
    pPager = pBVar3->pPager;
    uVar5 = pPager->errCode;
    if (uVar5 == 0) {
      pPager->iDataVersion = pPager->iDataVersion + 1;
      if (((pPager->eState != '\x02') || (pPager->exclusiveMode == '\0')) ||
         (pPager->journalMode != '\x01')) {
        uVar5 = pager_end_transaction(pPager,(uint)pPager->setSuper,1);
        if (((char)uVar5 == '\r') || ((uVar5 & 0xff) == 10)) {
          pPager->errCode = uVar5;
          pPager->eState = '\x06';
          if (uVar5 == 0) {
            if (pPager->bUseFetch == '\0') {
              pcVar6 = getPageNormal;
            }
            else {
              pcVar6 = getPageMMap;
            }
            pPager->xGet = pcVar6;
            goto LAB_00123f24;
          }
          pPager->xGet = getPageError;
        }
        goto LAB_00123e66;
      }
      pPager->eState = '\x01';
    }
    else {
LAB_00123e66:
      if ((bCleanup == 0) && (uVar5 != 0)) {
        if (p->sharable == '\0') {
          return uVar5;
        }
        piVar1 = &p->wantToLock;
        *piVar1 = *piVar1 + -1;
        iVar2 = *piVar1;
        goto joined_r0x00123f56;
      }
    }
LAB_00123f24:
    p->iBDataVersion = p->iBDataVersion - 1;
    pBVar3->inTransaction = '\x01';
    sqlite3BitvecDestroy(pBVar3->pHasContent);
    pBVar3->pHasContent = (Bitvec *)0x0;
  }
  btreeEndTransaction(p);
  if (p->sharable == '\0') {
    return 0;
  }
  piVar1 = &p->wantToLock;
  *piVar1 = *piVar1 + -1;
  iVar2 = *piVar1;
  uVar5 = 0;
joined_r0x00123f56:
  if (iVar2 == 0) {
    unlockBtreeMutex(p);
  }
  return uVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommitPhaseTwo(Btree *p, int bCleanup){

  if( p->inTrans==TRANS_NONE ) return SQLITE_OK;
  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the handle has a write-transaction open, commit the shared-btrees
  ** transaction and set the shared state to TRANS_READ.
  */
  if( p->inTrans==TRANS_WRITE ){
    int rc;
    BtShared *pBt = p->pBt;
    assert( pBt->inTransaction==TRANS_WRITE );
    assert( pBt->nTransaction>0 );
    rc = sqlite3PagerCommitPhaseTwo(pBt->pPager);
    if( rc!=SQLITE_OK && bCleanup==0 ){
      sqlite3BtreeLeave(p);
      return rc;
    }
    p->iBDataVersion--;  /* Compensate for pPager->iDataVersion++; */
    pBt->inTransaction = TRANS_READ;
    btreeClearHasContent(pBt);
  }

  btreeEndTransaction(p);
  sqlite3BtreeLeave(p);
  return SQLITE_OK;
}